

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

void __thiscall
CVmObjString::restore_from_file
          (CVmObjString *this,vm_obj_id_t param_1,CVmFile *fp,CVmObjFixup *param_3)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint16_t tmp;
  
  uVar1 = CVmFile::read_uint2(fp);
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
    (this->super_CVmObject).ext_ = (char *)0x0;
  }
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,(ulong)uVar1 + 2,this);
  (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar2);
  *(short *)CONCAT44(extraout_var,iVar2) = (short)uVar1;
  CVmFile::read_bytes(fp,(this->super_CVmObject).ext_ + 2,(ulong)uVar1);
  return;
}

Assistant:

void CVmObjString::restore_from_file(VMG_ vm_obj_id_t,
                                     CVmFile *fp, CVmObjFixup *)
{
    /* read the length prefix */
    size_t len = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* 
     *   allocate our extension - make room for the length prefix plus the
     *   bytes of the string
     */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(len + VMB_LEN, this);

    /* store our length prefix */
    vmb_put_len(ext_, len);

    /* read the string */
    fp->read_bytes(ext_ + VMB_LEN, len);
}